

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool google::protobuf::FileDescriptorSet::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = internal::ExtensionSet::IsInitialized
                    ((ExtensionSet *)(msg + 1),(MessageLite *)_FileDescriptorSet_default_instance_);
  if (bVar1) {
    bVar1 = internal::AllAreInitialized<google::protobuf::FileDescriptorProto>
                      ((RepeatedPtrField<google::protobuf::FileDescriptorProto> *)
                       &msg[2]._internal_metadata_);
    return bVar1;
  }
  return false;
}

Assistant:

PROTOBUF_NOINLINE bool FileDescriptorSet::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const FileDescriptorSet&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_file()))
    return false;
  return true;
}